

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSop.c
# Opt level: O1

void Abc_SopToTruthBig(char *pSop,int nInputs,word **pVars,word *pCube,word *pRes)

{
  char cVar1;
  word *pwVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  
  lVar9 = 0;
  do {
    if (pSop[lVar9] == '\0') {
      uVar5 = 0xffffffff;
LAB_0086a266:
      uVar8 = (uint)uVar5;
      uVar3 = 1 << ((char)uVar5 - 6U & 0x1f);
      if ((int)uVar8 < 7) {
        uVar3 = 1;
      }
      if (0x10 < uVar8) {
        __assert_fail("nVars >= 0 && nVars <= 16",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcSop.c"
                      ,0x52a,"void Abc_SopToTruthBig(char *, int, word **, word *, word *)");
      }
      if (uVar8 != nInputs) {
        __assert_fail("nVars == nInputs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcSop.c"
                      ,0x52b,"void Abc_SopToTruthBig(char *, int, word **, word *, word *)");
      }
      uVar11 = (ulong)uVar3;
      if (0 < (int)uVar3) {
        memset(pRes,0,uVar11 * 8);
      }
      uVar10 = 1;
      if (1 < (int)uVar8) {
        uVar10 = uVar5;
      }
      lVar9 = 0;
      do {
        if (0 < (int)uVar3) {
          memset(pCube,0xff,uVar11 * 8);
        }
        if (uVar8 != 0) {
          lVar9 = (long)(int)lVar9;
          uVar5 = 0;
          do {
            cVar1 = pSop[lVar9];
            if (cVar1 != '-') {
              if (cVar1 == '1') {
                if (0 < (int)uVar3) {
                  pwVar2 = pVars[uVar5];
                  uVar7 = 0;
                  do {
                    pCube[uVar7] = pCube[uVar7] & pwVar2[uVar7];
                    uVar7 = uVar7 + 1;
                  } while (uVar11 != uVar7);
                }
              }
              else {
                if (cVar1 != '0') {
                  __assert_fail("0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcSop.c"
                                ,0x53e,
                                "void Abc_SopToTruthBig(char *, int, word **, word *, word *)");
                }
                if (0 < (int)uVar3) {
                  pwVar2 = pVars[uVar5];
                  uVar7 = 0;
                  do {
                    pCube[uVar7] = pCube[uVar7] & ~pwVar2[uVar7];
                    uVar7 = uVar7 + 1;
                  } while (uVar11 != uVar7);
                }
              }
            }
            uVar5 = uVar5 + 1;
            lVar9 = lVar9 + 1;
          } while (uVar5 != uVar10);
        }
        if (0 < (int)uVar3) {
          uVar5 = 0;
          do {
            pRes[uVar5] = pRes[uVar5] | pCube[uVar5];
            uVar5 = uVar5 + 1;
          } while (uVar11 != uVar5);
        }
        lVar6 = (long)(int)lVar9;
        if (pSop[lVar6] != ' ') {
          __assert_fail("pSop[lit] == \' \'",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcSop.c"
                        ,0x542,"void Abc_SopToTruthBig(char *, int, word **, word *, word *)");
        }
        if (pSop[lVar6 + 2] != '\n') {
          __assert_fail("pSop[lit] == \'\\n\'",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcSop.c"
                        ,0x545,"void Abc_SopToTruthBig(char *, int, word **, word *, word *)");
        }
        lVar9 = lVar6 + 3;
      } while (pSop[lVar6 + 3] != '\0');
      iVar4 = Abc_SopIsComplement(pSop);
      if ((iVar4 != 0) && (0 < (int)uVar3)) {
        uVar5 = 0;
        do {
          pRes[uVar5] = ~pRes[uVar5];
          uVar5 = uVar5 + 1;
        } while (uVar11 != uVar5);
      }
      return;
    }
    if (pSop[lVar9] == '\n') {
      uVar5 = (ulong)((int)lVar9 - 2);
      goto LAB_0086a266;
    }
    lVar9 = lVar9 + 1;
  } while( true );
}

Assistant:

void Abc_SopToTruthBig( char * pSop, int nInputs, word ** pVars, word * pCube, word * pRes )
{
    int nVars = Abc_SopGetVarNum(pSop);
    int nWords = nVars <= 6 ? 1 : 1 << (nVars-6);
    int v, i, lit = 0;
    assert( nVars >= 0 && nVars <= 16 );
    assert( nVars == nInputs );
    for ( i = 0; i < nWords; i++ )
        pRes[i] = 0;
    do {
        for ( i = 0; i < nWords; i++ )
            pCube[i] = ~(word)0;
        for ( v = 0; v < nVars; v++, lit++ )
        {
            if ( pSop[lit] == '1' )
            {
                for ( i = 0; i < nWords; i++ )
                    pCube[i] &= pVars[v][i];
            }
            else if ( pSop[lit] == '0' )
            {
                for ( i = 0; i < nWords; i++ )
                    pCube[i] &= ~pVars[v][i];
            }
            else if ( pSop[lit] != '-' )
                assert( 0 );
        }
        for ( i = 0; i < nWords; i++ )
            pRes[i] |= pCube[i];
        assert( pSop[lit] == ' ' );
        lit++;
        lit++;
        assert( pSop[lit] == '\n' );
        lit++;
    } while ( pSop[lit] );
    if ( Abc_SopIsComplement(pSop) )
    {
        for ( i = 0; i < nWords; i++ )
            pRes[i] = ~pRes[i];
    }
}